

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_string.h
# Opt level: O0

const_iterator * __thiscall
agge::
annotated_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::ranges_end(const_iterator *__return_storage_ptr__,
            annotated_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  const_iterator next_annotation;
  const_iterator annotations_end;
  undefined1 local_30 [8];
  range r;
  annotated_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  r._annotation = &this->_underlying;
  range::range((range *)local_30,&this->_underlying);
  range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  set_end((range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_30);
  next_annotation =
       std::
       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->_annotations);
  annotations_end =
       std::
       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->_annotations);
  const_iterator::const_iterator
            (__return_storage_ptr__,(range *)local_30,next_annotation,annotations_end);
  return __return_storage_ptr__;
}

Assistant:

inline typename annotated_string<CharT, AnnotationT>::const_iterator
		annotated_string<CharT, AnnotationT>::ranges_end() const
	{
		range r(_underlying);

		return r.set_end(), const_iterator(r, _annotations.end(), _annotations.end());
	}